

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O2

void __thiscall xercesc_4_0::AbstractDOMParser::reset(AbstractDOMParser *this)

{
  BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl> *this_00;
  DOMDocumentImpl *toAdd;
  
  toAdd = this->fDocument;
  if ((toAdd != (DOMDocumentImpl *)0x0) && (this->fDocumentAdoptedByUser == false)) {
    this_00 = &this->fDocumentVector->super_BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl>;
    if (this_00 == (BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl> *)0x0) {
      this_00 = (BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl> *)
                XMemory::operator_new(0x30,this->fMemoryManager);
      RefVectorOf<xercesc_4_0::DOMDocumentImpl>::RefVectorOf
                ((RefVectorOf<xercesc_4_0::DOMDocumentImpl> *)this_00,10,true,this->fMemoryManager);
      this->fDocumentVector = (RefVectorOf<xercesc_4_0::DOMDocumentImpl> *)this_00;
      toAdd = this->fDocument;
    }
    BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl>::addElement(this_00,toAdd);
  }
  this->fDocument = (DOMDocumentImpl *)0x0;
  (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x1c])(this);
  this->fWithinElement = false;
  this->fDocumentAdoptedByUser = false;
  this->fCurrentParent = (DOMNode *)0x0;
  this->fCurrentNode = (DOMNode *)0x0;
  this->fCurrentEntity = (DOMEntityImpl *)0x0;
  this->fInternalSubset->fIndex = 0;
  return;
}

Assistant:

void AbstractDOMParser::reset()
{
    // if fDocument exists already, store the old pointer in the vector for deletion later
    if (fDocument && !fDocumentAdoptedByUser) {
        if (!fDocumentVector) {
            // allocate the vector if not exists yet
            fDocumentVector  = new (fMemoryManager) RefVectorOf<DOMDocumentImpl>(10, true, fMemoryManager) ;
        }
        fDocumentVector->addElement(fDocument);
    }

    fDocument = 0;
    resetDocType();
    fCurrentParent   = 0;
    fCurrentNode     = 0;
    fCurrentEntity   = 0;
    fWithinElement   = false;
    fDocumentAdoptedByUser = false;
    fInternalSubset.reset();
}